

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,char *type)

{
  int index;
  Layer *pLVar1;
  
  index = custom_layer_to_index(this,type);
  if (index != -1) {
    pLVar1 = create_custom_layer(this,index);
    return pLVar1;
  }
  return (Layer *)0x0;
}

Assistant:

Layer* Net::create_custom_layer(const char* type)
{
    int index = custom_layer_to_index(type);
    if (index == -1)
        return 0;

    return create_custom_layer(index);
}